

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall tonk::gateway::StateMachine::OnTick(StateMachine *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  shared_ptr<tonk::gateway::HTTPRequester> *in_RDI;
  ControlEndpoint *control;
  int controlIndex;
  int controlCount;
  value_type *gateway;
  int gatewayIndex;
  int gatewayCount;
  uint64_t nowUsec;
  SSDPRequester *in_stack_00000048;
  int in_stack_000000bc;
  StateMachine *in_stack_000000c0;
  int in_stack_000003a4;
  StateMachine *in_stack_000003a8;
  shared_ptr<tonk::gateway::HTTPRequester> *in_stack_ffffffffffffffc0;
  int local_38;
  vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
  *in_stack_ffffffffffffffd0;
  StateMachine *in_stack_ffffffffffffffe0;
  int local_18;
  
  API_CopyRequests(in_stack_ffffffffffffffe0);
  SSDPRequester::OnTick(in_stack_00000048);
  bVar1 = std::
          vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>::
          empty(in_stack_ffffffffffffffd0);
  if (!bVar1) {
    siamese::GetTimeUsec();
    sVar2 = std::
            vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
            ::size((vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                    *)(in_RDI + 7));
    for (local_18 = 0; local_18 < (int)sVar2; local_18 = local_18 + 1) {
      pvVar3 = std::
               vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
               ::operator[]((vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                             *)(in_RDI + 7),(long)local_18);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pvVar3->Requester);
      if (bVar1) {
        std::
        __shared_ptr_access<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x19b75c);
        bVar1 = HTTPRequester::OnTick_IsDisposable(_gatewayIndex,(uint64_t)gateway);
        if (bVar1) {
          std::shared_ptr<tonk::gateway::HTTPRequester>::shared_ptr
                    (in_stack_ffffffffffffffc0,in_RDI);
          std::shared_ptr<tonk::gateway::HTTPRequester>::operator=(in_stack_ffffffffffffffc0,in_RDI)
          ;
          std::shared_ptr<tonk::gateway::HTTPRequester>::~shared_ptr
                    ((shared_ptr<tonk::gateway::HTTPRequester> *)0x19b79d);
          goto LAB_0019b7a3;
        }
      }
      else {
LAB_0019b7a3:
        if (0 < pvVar3->RetriesRemaining) {
          BeginGatewayXMLRequest(in_stack_000003a8,in_stack_000003a4);
        }
      }
    }
    sVar2 = std::
            vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
            ::size((vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                    *)&in_RDI[8].
                       super___shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    for (local_38 = 0; local_38 < (int)sVar2; local_38 = local_38 + 1) {
      pvVar4 = std::
               vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
               ::operator[]((vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                             *)&in_RDI[8].
                                super___shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,(long)local_38);
      if ((pvVar4->EndpointActive & 1U) != 0) {
        BeginControlSOAPRequests(in_stack_000000c0,in_stack_000000bc);
      }
    }
  }
  return;
}

Assistant:

void StateMachine::OnTick()
{
    API_CopyRequests();

    SSDP->OnTick();

    if (GatewayEndpoints.empty()) {
        return;
    }

    const uint64_t nowUsec = siamese::GetTimeUsec();

    const int gatewayCount = (int)GatewayEndpoints.size();
    for (int gatewayIndex = 0; gatewayIndex < gatewayCount; ++gatewayIndex)
    {
        auto& gateway = GatewayEndpoints[gatewayIndex];

        // If request is in progress:
        if (gateway.Requester)
        {
            // If the requester is dead:
            if (gateway.Requester->OnTick_IsDisposable(nowUsec)) {
                // Free it so we can try again
                gateway.Requester = nullptr;
            }
            else {
                continue;
            }
        }

        // If there are no more retries:
        if (gateway.RetriesRemaining <= 0) {
            continue; // Do not retry
        }

        BeginGatewayXMLRequest(gatewayIndex);
    }

    // Begin control SOAP requests for each endpoint
    const int controlCount = (int)ControlEndpoints.size();
    for (int controlIndex = 0; controlIndex < controlCount; ++controlIndex)
    {
        ControlEndpoint& control = ControlEndpoints[controlIndex];

        // If endpoint is not active:
        if (!control.EndpointActive) {
            continue;
        }

        BeginControlSOAPRequests(controlIndex);
    }
}